

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_func(LexState *ls,BCLine line)

{
  long lVar1;
  undefined4 in_ESI;
  long *in_RDI;
  int needself;
  ExpDesc b;
  ExpDesc v;
  FuncState *fs;
  BCLine in_stack_000002c0;
  int in_stack_000002c4;
  ExpDesc *in_stack_000002c8;
  LexState *in_stack_000002d0;
  undefined4 in_stack_ffffffffffffffb0;
  int first;
  ExpDesc *in_stack_ffffffffffffffb8;
  ExpDesc *in_stack_ffffffffffffffc0;
  FuncState *in_stack_ffffffffffffffc8;
  FuncState *in_stack_ffffffffffffffd0;
  
  first = 0;
  lj_lex_next((LexState *)0x14ffbf);
  lex_str((LexState *)CONCAT44(first,in_stack_ffffffffffffffb0));
  var_lookup_(in_stack_ffffffffffffffc8,(GCstr *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
              ,first);
  while (*(int *)((long)in_RDI + 0x34) == 0x2e) {
    expr_field((LexState *)in_stack_ffffffffffffffd0,(ExpDesc *)in_stack_ffffffffffffffc8);
  }
  if (*(int *)((long)in_RDI + 0x34) == 0x3a) {
    expr_field((LexState *)in_stack_ffffffffffffffd0,(ExpDesc *)in_stack_ffffffffffffffc8);
  }
  parse_body(in_stack_000002d0,in_stack_000002c8,in_stack_000002c4,in_stack_000002c0);
  lVar1 = *in_RDI;
  bcemit_store(in_stack_ffffffffffffffd0,(ExpDesc *)in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0);
  *(undefined4 *)(*(long *)(lVar1 + 0x48) + 4 + (ulong)(*(int *)(lVar1 + 0x28) - 1) * 8) = in_ESI;
  return;
}

Assistant:

static void parse_func(LexState *ls, BCLine line)
{
  FuncState *fs;
  ExpDesc v, b;
  int needself = 0;
  lj_lex_next(ls);  /* Skip 'function'. */
  /* Parse function name. */
  var_lookup(ls, &v);
  while (ls->tok == '.')  /* Multiple dot-separated fields. */
    expr_field(ls, &v);
  if (ls->tok == ':') {  /* Optional colon to signify method call. */
    needself = 1;
    expr_field(ls, &v);
  }
  parse_body(ls, &b, needself, line);
  fs = ls->fs;
  bcemit_store(fs, &v, &b);
  fs->bcbase[fs->pc - 1].line = line;  /* Set line for the store. */
}